

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_7::ToString<signed_char>
                   (string *__return_storage_ptr__,char value)

{
  char value_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,(int)value);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T value) {
  if (std::is_floating_point<T>::value) {
    std::stringstream ss;
    ss << value;
    return ss.str();
  } else {
    return std::to_string(value);
  }
}